

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O2

void __thiscall
adios2::EVPathRemote::Open
          (EVPathRemote *this,string *hostname,int32_t port,string *filename,Mode mode,
          bool RowMajorOrdering)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  CMConnection p_Var6;
  _OpenFileMsg open_msg;
  
  InitCMData(this);
  uVar4 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  pcVar5 = strdup((hostname->_M_dataplus)._M_p);
  add_attr(uVar4,uVar1,3,pcVar5);
  add_attr(uVar4,uVar2,1,(long)port);
  p_Var6 = (CMConnection)CMinitiate_conn((this->ev_state).cm,uVar4);
  this->m_conn = p_Var6;
  if ((p_Var6 == (CMConnection)0x0) &&
     ((pcVar5 = getenv("DoRemote"), pcVar5 != (char *)0x0 ||
      (pcVar5 = getenv("DoFileRemote"), pcVar5 != (char *)0x0)))) {
    open_msg.OpenResponseCondition = 1000;
    open_msg._4_4_ = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&open_msg);
    p_Var6 = (CMConnection)CMinitiate_conn((this->ev_state).cm,uVar4);
    this->m_conn = p_Var6;
  }
  free_attr_list(uVar4);
  if (this->m_conn != (CMConnection)0x0) {
    open_msg.OpenResponseCondition = 0;
    open_msg._4_4_ = 0;
    open_msg.FileName = (filename->_M_dataplus)._M_p;
    open_msg._17_7_ = 0;
    open_msg.Mode._0_1_ = mode == ReadRandomAccess;
    iVar3 = CMCondition_get((this->ev_state).cm);
    open_msg.OpenResponseCondition = iVar3;
    open_msg.RowMajorOrder._0_1_ = RowMajorOrdering;
    open_msg.RowMajorOrder._1_3_ = 0;
    CMCondition_set_client_data((this->ev_state).cm,iVar3,this);
    CMwrite(this->m_conn,(this->ev_state).OpenFileFormat,&open_msg);
    CMCondition_wait((this->ev_state).cm,open_msg._0_8_ & 0xffffffff);
    this->m_Active = true;
  }
  return;
}

Assistant:

void EVPathRemote::Open(const std::string hostname, const int32_t port, const std::string filename,
                        const Mode mode, bool RowMajorOrdering)
{

    EVPathRemoteCommon::_OpenFileMsg open_msg;
    InitCMData();
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)strdup(hostname.c_str()));
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)port);
    m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    if ((m_conn == NULL) && (getenv("DoRemote") || getenv("DoFileRemote")))
    {
        // if we didn't find a server, but we're in testing, wait briefly and try again
        std::this_thread::sleep_for(std::chrono::milliseconds(1000));
        m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    }
    free_attr_list(contact_list);
    if (!m_conn)
        return;

    memset(&open_msg, 0, sizeof(open_msg));
    open_msg.FileName = (char *)filename.c_str();
    switch (mode)
    {
    case Mode::Read:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpen;
        break;
    case Mode::ReadRandomAccess:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpenRandomAccess;
        break;
    default:
        break;
    }
    open_msg.OpenResponseCondition = CMCondition_get(ev_state.cm, m_conn);
    open_msg.RowMajorOrder = RowMajorOrdering;
    CMCondition_set_client_data(ev_state.cm, open_msg.OpenResponseCondition, (void *)this);
    CMwrite(m_conn, ev_state.OpenFileFormat, &open_msg);
    CMCondition_wait(ev_state.cm, open_msg.OpenResponseCondition);
    m_Active = true;
}